

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieparser.cpp
# Opt level: O0

void __thiscall
LottieParserImpl::parsePropertyHelper<VPointF,void>
          (LottieParserImpl *this,Property<VPointF,_void> *obj)

{
  bool bVar1;
  int iVar2;
  Property<VPointF,_void> *in_RSI;
  LottieParserImpl *in_RDI;
  VPointF *in_stack_00000018;
  LottieParserImpl *in_stack_00000020;
  KeyFrames<VPointF,_void> *in_stack_000000d8;
  LottieParserImpl *in_stack_000000e0;
  
  iVar2 = PeekType(in_RDI);
  if (iVar2 == 6) {
    bVar1 = rlottie::internal::model::Property<VPointF,_void>::isStatic(in_RSI);
    if (bVar1) {
      rlottie::internal::model::Property<VPointF,_void>::value(in_RSI);
      getValue(in_stack_00000020,in_stack_00000018);
    }
    else {
      (in_RDI->super_LookaheadParserHandler).st_ = kError;
    }
  }
  else {
    EnterArray(in_RDI);
    while (bVar1 = NextArrayValue(in_RDI), bVar1) {
      iVar2 = PeekType(in_RDI);
      if (iVar2 != 3) {
        bVar1 = rlottie::internal::model::Property<VPointF,_void>::isStatic(in_RSI);
        if (!bVar1) {
          (in_RDI->super_LookaheadParserHandler).st_ = kError;
          return;
        }
        rlottie::internal::model::Property<VPointF,_void>::value(in_RSI);
        getValue(in_stack_00000020,in_stack_00000018);
        break;
      }
      rlottie::internal::model::Property<VPointF,_void>::animation(in_RSI);
      parseKeyFrame<VPointF,void>(in_stack_000000e0,in_stack_000000d8);
    }
    rlottie::internal::model::Property<VPointF,_void>::cache(in_RSI);
  }
  return;
}

Assistant:

void LottieParserImpl::parsePropertyHelper(model::Property<T, Tag> &obj)
{
    if (PeekType() == kNumberType) {
        if (!obj.isStatic()) {
            st_ = kError;
            return;
        }
        /*single value property with no animation*/
        getValue(obj.value());
    } else {
        EnterArray();
        while (NextArrayValue()) {
            /* property with keyframe info*/
            if (PeekType() == kObjectType) {
                parseKeyFrame(obj.animation());
            } else {
                /* Read before modifying.
                 * as there is no way of knowing if the
                 * value of the array is either array of numbers
                 * or array of object without entering the array
                 * thats why this hack is there
                 */
                if (!obj.isStatic()) {
                    st_ = kError;
                    return;
                }
                /*multi value property with no animation*/
                getValue(obj.value());
                /*break here as we already reached end of array*/
                break;
            }
        }
        obj.cache();
    }
}